

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

void ps_mask_table_done(PS_Mask_Table table,FT_Memory memory)

{
  PS_Mask local_28;
  PS_Mask mask;
  FT_UInt count;
  FT_Memory memory_local;
  PS_Mask_Table table_local;
  
  local_28 = table->masks;
  for (mask._4_4_ = table->max_masks; mask._4_4_ != 0; mask._4_4_ = mask._4_4_ - 1) {
    ps_mask_done(local_28,memory);
    local_28 = local_28 + 1;
  }
  ft_mem_free(memory,table->masks);
  table->masks = (PS_Mask)0x0;
  table->num_masks = 0;
  table->max_masks = 0;
  return;
}

Assistant:

static void
  ps_mask_table_done( PS_Mask_Table  table,
                      FT_Memory      memory )
  {
    FT_UInt  count = table->max_masks;
    PS_Mask  mask  = table->masks;


    for ( ; count > 0; count--, mask++ )
      ps_mask_done( mask, memory );

    FT_FREE( table->masks );
    table->num_masks = 0;
    table->max_masks = 0;
  }